

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void CVmPack::unpack_item(vm_val_t *val,CVmDataSource *src,CVmPackType *t,CVmPackGroup *group)

{
  wchar_t wVar1;
  CVmObjPageEntry *pCVar2;
  ushort *puVar3;
  uint uVar4;
  int32_t val_1;
  int iVar5;
  int iVar6;
  uint uVar7;
  CharConv *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  void *pvVar9;
  char *ptr;
  long lVar10;
  byte bVar11;
  size_t len;
  ulong uVar12;
  char buf [256];
  undefined8 uStack_140;
  uint local_138;
  int local_134;
  
  uStack_140 = (code *)0x2b22e1;
  this = CharConv::conv_for_type(t);
  if (this != (CharConv *)0x0) {
    if ((t->null_term != 0) && (t->count < 1)) {
      CharConv::unpackz(this,val,src);
      return;
    }
    uVar12 = 1;
    if (-1 < t->count) {
      uVar12 = (ulong)(uint)t->count;
    }
    if (t->count_in_bytes != 0) {
      uStack_140 = (code *)0x2b2323;
      uVar12 = (**(code **)(*(long *)this + 0x20))();
    }
    uVar7 = (uint)uVar12;
    if (uVar7 != 0) {
      if ((t->count == -2) || (t->up_to_count != 0)) {
        uStack_140 = (code *)0x2b234a;
        iVar5 = (*src->_vptr_CVmDataSource[6])(src);
        uStack_140 = (code *)0x2b2356;
        iVar6 = (*src->_vptr_CVmDataSource[7])(src);
        uStack_140 = (code *)0x2b2366;
        uVar8 = (**(code **)(*(long *)this + 0x20))
                          (this,CONCAT44(extraout_var,iVar5) - CONCAT44(extraout_var_00,iVar6));
        if (t->count == -2) {
          uVar12 = uVar8 & 0xffffffff;
          if (0x7fffffff < (long)uVar8) {
LAB_002b2684:
            uStack_140 = (code *)0x2b268e;
            err_throw(0x7e7);
          }
        }
        else {
          uVar4 = (uint)uVar8;
          if ((long)(int)uVar7 <= (long)uVar8) {
            uVar4 = uVar7;
          }
          uVar12 = (ulong)uVar4;
        }
      }
      uStack_140 = (code *)0x2b2472;
      pvVar9 = memchr("AUW",(int)(char)t->type_code,4);
      uStack_140 = (code *)0x2b2493;
      (**(code **)(*(long *)this + 0x30))
                (this,val,src,uVar12 & 0xffffffff,(ulong)(pvVar9 != (void *)0x0) << 5);
      if (t->null_term == 0) {
        return;
      }
      uStack_140 = (code *)0x2b24ab;
      (**(code **)(*(long *)this + 0x38))(this,src);
      if (val->typ != VM_OBJ) {
        return;
      }
      uStack_140 = (code *)0x2b24e8;
      iVar5 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))();
      if (iVar5 == 0) {
        return;
      }
      pCVar2 = G_obj_table_X.pages_[(val->val).obj >> 0xc];
      uVar7 = (val->val).obj & 0xfff;
      puVar3 = *(ushort **)((long)&pCVar2[uVar7].ptr_ + 8);
      uStack_140 = (code *)0x2b251c;
      ptr = (char *)memchr(puVar3 + 1,0,(ulong)*puVar3);
      if (ptr == (char *)0x0) {
        return;
      }
      CVmObjString::cons_shrink_buffer((CVmObjString *)(pCVar2 + uVar7),ptr);
      return;
    }
    uStack_140 = (code *)0x2b23d6;
    local_138 = CVmObjString::create(0,0);
    goto LAB_002b2768;
  }
  wVar1 = t->type_code;
  if (wVar1 < L'Q') {
    if (wVar1 == L'@') {
      uStack_140 = (code *)0x2b257d;
      iVar5 = (*src->_vptr_CVmDataSource[7])(src);
      if (t->bang == 0) {
        iVar6 = (int)group->stream_ofs;
      }
      else {
        uStack_140 = (code *)0x2b2593;
        lVar10 = CVmPackGroup::root_stream_ofs(group);
        iVar6 = (int)lVar10;
      }
      val->typ = VM_INT;
      (val->val).obj = iVar5 - iVar6;
      return;
    }
    if (wVar1 != L'C') {
      if (wVar1 != L'L') {
        return;
      }
      uStack_140 = (code *)0x2b240c;
      read_num_bytes((char *)&local_138,src,4,t);
      if ((-1 < (int)local_138) && (t->tilde != 0)) {
        val->typ = VM_INT;
        (val->val).intval = local_138;
        return;
      }
      uStack_140 = (code *)0x2b270a;
      local_138 = CVmObjBigNum::createu(0,(ulong)local_138,10);
      goto LAB_002b2768;
    }
    uStack_140 = (code *)0x2b25a9;
    iVar5 = (*src->_vptr_CVmDataSource[2])(src,&local_138,1);
    if (iVar5 != 0) goto LAB_002b2783;
    local_138 = local_138 & 0xff;
    goto LAB_002b2737;
  }
  switch(wVar1) {
  case L'c':
    uStack_140 = (code *)0x2b23bc;
    iVar5 = (*src->_vptr_CVmDataSource[2])(src,&local_138,1);
    if (iVar5 != 0) {
LAB_002b2783:
      uStack_140 = read_num_bytes;
      err_throw(0x65);
    }
    local_138 = (uint)(char)(byte)local_138;
    break;
  case L'd':
    uStack_140 = (code *)0x2b2641;
    read_num_bytes((char *)&local_138,src,8,t);
    iVar5 = 0x40;
    goto LAB_002b26ae;
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'm':
  case L'n':
  case L'o':
  case L'p':
  case L'r':
    goto switchD_002b23a9_caseD_65;
  case L'f':
    uStack_140 = (code *)0x2b26a4;
    read_num_bytes((char *)&local_138,src,4,t);
    iVar5 = 0x20;
LAB_002b26ae:
    uStack_140 = (code *)0x2b26b3;
    local_138 = CVmObjBigNum::create_from_ieee754(0,(char *)&local_138,iVar5);
LAB_002b2768:
    val->typ = VM_OBJ;
    goto LAB_002b276e;
  case L'k':
    uVar12 = 0;
LAB_002b2650:
    uStack_140 = (code *)0x2b2662;
    iVar5 = (*src->_vptr_CVmDataSource[2])(src,(long)&local_138 + uVar12,1);
    if (iVar5 == 0) {
      if ((char)*(byte *)((long)&local_138 + uVar12) < '\0') goto code_r0x002b2672;
      len = uVar12 + 1;
      if ((uVar12 < 4) || ((uVar12 == 4 && ((byte)local_138 < 8)))) {
        bVar11 = 0;
        local_138 = 0;
        do {
          local_138 = local_138 + ((int)*(char *)((long)&uStack_140 + len + 7) << (bVar11 & 0x1f));
          bVar11 = bVar11 + 7;
          len = len - 1;
        } while (len != 0);
        break;
      }
      uStack_140 = (code *)0x2b2768;
      local_138 = CVmObjBigNum::create_from_ber(0,(char *)&local_138,len);
      goto LAB_002b2768;
    }
    goto LAB_002b2783;
  case L'l':
    uStack_140 = (code *)0x2b25d0;
    read_num_bytes((char *)&local_138,src,4,t);
    break;
  case L'q':
    uStack_140 = (code *)0x2b25ec;
    read_num_bytes((char *)&local_138,src,8,t);
    if ((t->tilde == 0) ||
       (((int)local_138 < 0 || local_134 != 0) && (local_134 != -1 || (int)local_138 >= 0))) {
      uStack_140 = (code *)0x2b2626;
      local_138 = CVmObjBigNum::create_rp8s(0,(char *)&local_138);
      goto LAB_002b2768;
    }
    break;
  case L's':
    uStack_140 = (code *)0x2b26ce;
    read_num_bytes((char *)&local_138,src,2,t);
    local_138 = (uint)(short)local_138;
    break;
  default:
    if (wVar1 == L'Q') {
      uStack_140 = (code *)0x2b271f;
      read_num_bytes((char *)&local_138,src,8,t);
      if (((t->tilde == 0) || (local_134 != 0)) || ((int)local_138 < 0)) {
        uStack_140 = (code *)0x2b275c;
        local_138 = CVmObjBigNum::create_rp8(0,(char *)&local_138);
        goto LAB_002b2768;
      }
    }
    else {
      if (wVar1 != L'S') {
        return;
      }
      uStack_140 = (code *)0x2b256a;
      read_num_bytes((char *)&local_138,src,2,t);
      local_138 = local_138 & 0xffff;
    }
  }
LAB_002b2737:
  val->typ = VM_INT;
LAB_002b276e:
  (val->val).obj = local_138;
switchD_002b23a9_caseD_65:
  return;
code_r0x002b2672:
  *(byte *)((long)&local_138 + uVar12) = *(byte *)((long)&local_138 + uVar12) & 0x7f;
  uVar12 = uVar12 + 1;
  if (uVar12 == 0x100) goto LAB_002b2684;
  goto LAB_002b2650;
}

Assistant:

void CVmPack::unpack_item(VMG_ vm_val_t *val,
                          CVmDataSource *src, const CVmPackType *t,
                          const CVmPackGroup *group)
{
    /* check for a character conversion */
    CharConv *cvtchar = CharConv::conv_for_type(t);
    if (cvtchar != 0 && t->null_term && t->count <= 0)
    {
        /* 
         *   It's a null-terminated string type without a fixed field width.
         *   Use the special unpacking method for this type.  
         */
        cvtchar->unpackz(vmg_ val, src);

        /* done */
        return;
    }
    if (cvtchar != 0)
    {
        /* character string - the repeat count is the length */
        int count = t->get_count();

        /* if the count is in bytes, convert it */
        if (t->count_in_bytes)
            count = cvtchar->bytes_to_count(count);

        /* if the character count is zero, return an empty string */
        if (count == 0)
        {
            val->set_obj(CVmObjString::create(vmg_ FALSE, 0));
            return;
        }

        /* if it's '*', we read the rest of the data source */
        if (t->count == ITER_STAR || t->up_to_count)
        {
            /* 
             *   get the remaining length, and convert it to a repeat count
             *   appropriate to the string conversion type 
             */
            long l = cvtchar->bytes_to_count(src->get_size() - src->get_pos());

            /* use 'l' as a maximum for 'n*', or the actual count for '*' */
            if (t->count == ITER_STAR)
            {
                /* 
                 *   '*' means read the whole rest of the file - that's a
                 *   long value, so cast it to int, making sure we don't
                 *   overflow 
                 */
                count = (int)l;
                if (l > INT_MAX)
                    err_throw(VMERR_NUM_OVERFLOW);
            }
            else
            {
                /* 
                 *   'n*' means read up to n, stopping at EOF, so stop at 'l'
                 *   if it's less than the specified count 
                 */
                if (l < count)
                    count = (int)l;
            }
        }

        /* figure the padding type */
        char pad = get_padding_char(t->type_code);

        /* unpack the string */
        cvtchar->unpack(vmg_ val, src, count, pad);

        /* check for null termination */
        if (t->null_term)
        {
            /* skip the null, which is tacked on after the fixed length */
            cvtchar->readch(src);

            /* terminate the string at the first null, if present */
            if (val->typ == VM_OBJ
                && CVmObjString::is_string_obj(vmg_ val->val.obj))
            {
                /* get the string */
                CVmObjString *str = (CVmObjString *)vm_objp(vmg_ val->val.obj);

                /* scan for a null byte */
                char *nul = (char *)memchr(
                    str->cons_get_buf(), 0, str->cons_get_len());

                /* if we found a null byte, terminate the string there */
                if (nul != 0)
                    str->cons_shrink_buffer(vmg_ nul);
            }
        }

        /* done */
        return;
    }

    /* it's not a string; check the numeric types */
    char buf[256];
    switch (t->type_code)
    {
    case '@':
        /* 
         *   @? retrieves the current position, relative to the current group
         *   or, if ! is specified, relative to the start of the string
         */
        val->set_int(src->get_pos() -
                     (t->bang ? group->root_stream_ofs() : group->stream_ofs));
        break;
        
    case 'c':
        /* signed byte */
        read_num_bytes(buf, src, 1, t);
        val->set_int((char)buf[0]);
        break;

    case 'C':
        /* unsigned byte */
        read_num_bytes(buf, src, 1, t);
        val->set_int((unsigned char)buf[0]);
        break;

    case 's':
        /* signed 16-bit short */
        read_num_bytes(buf, src, 2, t);
        val->set_int(osrp2s(buf));
        break;
        
    case 'S':
        /* unsigned 16-bit short */
        read_num_bytes(buf, src, 2, t);
        val->set_int((unsigned short)osrp2(buf));
        break;
        
    case 'l':
        /* signed 32-bit long */
        read_num_bytes(buf, src, 4, t);
        val->set_int(osrp4s(buf));
        break;
        
    case 'L':
        /*
         *   Unsigned 32-bit long.  The VM_INT type is a signed long, so we
         *   can't use this to represent the full range of unsigned longs.
         *   Instead, use BigNumber.  Note that we could check the file value
         *   and use VM_INT if the value actually fits (i.e., it's less than
         *   0x7fffffff); this might be desirable in some cases because
         *   VM_INT is much more efficient than BigNumber.  However, since
         *   the caller is asking for type 'L', they're clearly expecting the
         *   full unsigned 32-bit range, which might mean they plan to do
         *   further arithmetic on the value we read, in which case they'd
         *   expect this arithmetic to be safe on unsigned 32-bit values.
         *   The only way we can guarantee this is to use a BigNumber for the
         *   value regardless of whether or not it fits in a VM_INT.
         *   
         *   If the ~ qualifier is set, unpack into an int if the value fits
         *   in a signed 32-bit int.  
         */
        {
            read_num_bytes(buf, src, 4, t);
            unsigned long lu = osrp4(buf);
            if (t->tilde && lu <= 0x7fffffff)
                val->set_int((long)lu);
            else
                val->set_obj(CVmObjBigNum::createu(vmg_ FALSE, lu, 10));
        }
        break;

    case 'q':
        /* 
         *   "Long long" 64-bit integer, signed.  There's no VM_xxx primitive
         *   type that can handle a value this large, so use BigNumber.  Read
         *   the 8-byte file value.
         *   
         *   If the ~ qualifier is set, and the high part of the value is all
         *   zeros or all '1' bits, return it as an integer.  Note that the
         *   buffer is in our standard osrp8 format, which is little-endian
         *   2's complement, so we can inspect the byte values portably.  
         */
        read_num_bytes(buf, src, 8, t);
        if (t->tilde
            && ((memcmp(buf+4, "\0\0\0\0", 4) == 0
                 && (buf[3] & 0x80) == 0)
                || (memcmp(buf+4, "\377\377\377\377", 4) == 0
                    && (buf[3] & 0x80) != 0)))
            val->set_int(osrp4s(buf));
        else
            val->set_obj(CVmObjBigNum::create_rp8s(vmg_ FALSE, buf));
        break;

    case 'Q':
        /* 
         *   "Long long" 64-bit integer, unsigned.  Unpack as a BigNumber,
         *   unless the ~ qualifier is set and the value will fit in an int.
         */
        read_num_bytes(buf, src, 8, t);
        if (t->tilde
            && memcmp(buf+4, "\0\0\0\0", 4) == 0
            && (buf[3] & 0x80) == 0)
            val->set_int(osrp4s(buf));
        else
            val->set_obj(CVmObjBigNum::create_rp8(vmg_ FALSE, buf));
        break;

    case 'k':
        /* 
         *   BER compressed unsigned integer.  This is a sequence of 7-bit,
         *   base-128 "digits", most significant digit first.  The high bit
         *   (0x80) is set on each digit except the last, which tells us
         *   where the value ends.  Read bytes one at a time until we reach
         *   the last byte or run out of buffer space.  
         */
        {
            size_t i;
            for (i = 0 ; ; )
            {
                /* if we're out of buffer space, throw an error */
                if (i >= sizeof(buf))
                    err_throw(VMERR_NUM_OVERFLOW);

                /* read the next byte */
                if (src->read(buf + i, 1))
                    err_throw(VMERR_READ_FILE);

                /* if the high bit isn't set, this is the last byte */
                if ((buf[i++] & 0x80) == 0)
                    break;

                /* keep just the low-order 7 bits of the value */
                buf[i-1] &= 0x7F;
            }

            /* 
             *   If the value is 31 bits or fewer, return it as an integer.
             *   Otherwise, return it as a BigNumber.  31 bits fits in 4
             *   bytes (7*4=28) plus 3 bits of the MSB, so if we have more
             *   than 5 bytes, or any of bits 4-8 of the MSB are set, we need
             *   a BigNumber.  (Why 31 bits and not 32?  Because BER values
             *   are unsigned, and our int32 type is signed, meaning it only
             *   holds 31 bits for a positive value.)  
             */
            if (i < 5 || (i == 5 && (buf[0] & 0xF8) == 0))
            {
                /* it fits in a 32-bit integer - decode it */
                val->set_int(decode_ber(buf, i));
            }
            else
            {
                /* more than 31 bits - decode into a BigNumber */
                val->set_obj(CVmObjBigNum::create_from_ber(vmg_ FALSE, buf, i));
            }
        }
        break;
        
    case 'f':
        /* 
         *   Float - read the 32-bit float value, and return it as a
         *   BigNumber value.  Our standard IEEE 754-2008 32-bit format
         *   represents 7.22 decimal digits of precision, so keep 8 digits.  
         */
        read_num_bytes(buf, src, 4, t);
        val->set_obj(CVmObjBigNum::create_from_ieee754(vmg_ FALSE, buf, 32));
        break;
        
    case 'd':
        /* 
         *   Double - read the 64-bit double value, and return it as a
         *   BigNumber value.  Our standard IEEE 754-2008 64-bit format
         *   represents 15.95 decimal digits of precision.  
         */
        read_num_bytes(buf, src, 8, t);
        val->set_obj(CVmObjBigNum::create_from_ieee754(vmg_ FALSE, buf, 64));
        break;
    }
}